

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O3

void decompressBlockAlphaC(uint8 *data,uint8 *img,int width,int height,int ix,int iy,int channels)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint8 uVar4;
  int iVar5;
  long lVar6;
  char cVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  int y;
  long lVar11;
  int iVar12;
  int iVar13;
  
  bVar1 = *data;
  bVar2 = data[1];
  iVar13 = 2;
  lVar6 = 0;
  iVar10 = 0;
  do {
    lVar11 = 0;
    do {
      uVar9 = 0;
      iVar12 = -5;
      cVar7 = '\x05';
      iVar5 = iVar10;
      do {
        iVar10 = iVar5 + 1;
        if (6 < iVar5) {
          iVar10 = 0;
        }
        uVar8 = 1 << ((byte)-(iVar5 + -7) & 0x1f) & (uint)data[iVar13];
        uVar3 = uVar8 << ((char)iVar5 + (char)iVar12 & 0x1fU);
        if (iVar12 + 7 < -(iVar5 + -7)) {
          uVar3 = uVar8 >> (cVar7 - (char)iVar5 & 0x1fU);
        }
        uVar9 = (ulong)((uint)uVar9 | uVar3 & 0xff);
        iVar13 = iVar13 + (uint)(6 < iVar5);
        iVar12 = iVar12 + -1;
        cVar7 = cVar7 + '\x01';
        iVar5 = iVar10;
      } while (iVar12 != -8);
      iVar5 = alphaTable[bVar2][uVar9] + (uint)bVar1;
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      uVar4 = (uint8)iVar5;
      if (0xfe < iVar5) {
        uVar4 = 0xff;
      }
      img[((iy + lVar11) * (long)width + ix + lVar6) * (long)channels] = uVar4;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  return;
}

Assistant:

void decompressBlockAlphaC(uint8* data, uint8* img, int width, int height, int ix, int iy, int channels) 
{
	int alpha = data[0];
	int table = data[1];
	
	int bit=0;
	int byte=2;
	//extract an alpha value for each pixel.
	for(int x=0; x<4; x++) 
	{
		for(int y=0; y<4; y++) 
		{
			//Extract table index
			int index=0;
			for(int bitpos=0; bitpos<3; bitpos++) 
			{
				index|=getbit(data[byte],7-bit,2-bitpos);
				bit++;
				if(bit>7) 
				{
					bit=0;
					byte++;
				}
			}
			img[(ix+x+(iy+y)*width)*channels]=clamp(alpha +alphaTable[table][index]);
		}
	}
}